

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O3

void __thiscall cmCoreTryCompile::FindOutputFile(cmCoreTryCompile *this,string *targetName)

{
  bool bVar1;
  int iVar2;
  cmGlobalGenerator *pcVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string outputFileLocation;
  string tmpOutputFile;
  string command;
  ostringstream emsg_1;
  ifstream ifs;
  string local_450;
  long *local_430 [2];
  long local_420 [2];
  string local_410;
  string local_3f0;
  undefined8 local_3d0;
  char *local_3c8;
  string local_3c0;
  undefined1 local_3a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  undefined8 local_380;
  char *local_378;
  ios_base local_330 [264];
  undefined1 local_228 [24];
  long *local_210;
  ios_base local_1b8 [408];
  
  (this->FindErrorMessage)._M_string_length = 0;
  *(this->FindErrorMessage)._M_dataplus._M_p = '\0';
  (this->OutputFile)._M_string_length = 0;
  *(this->OutputFile)._M_dataplus._M_p = '\0';
  local_430[0] = local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"/","");
  std::__cxx11::string::_M_append((char *)local_430,(ulong)(targetName->_M_dataplus)._M_p);
  pcVar3 = cmMakefile::GetGlobalGenerator(this->Makefile);
  iVar2 = (*pcVar3->_vptr_cmGlobalGenerator[0x26])(pcVar3);
  if ((char)iVar2 != '\0') {
    std::__cxx11::string::append((char *)local_430);
  }
  std::__cxx11::string::append((char *)local_430);
  local_228._8_8_ = (this->BinaryDirectory)._M_dataplus._M_p;
  local_228._0_8_ = (this->BinaryDirectory)._M_string_length;
  local_228._16_8_ = local_430[1];
  local_210 = local_430[0];
  views._M_len = 2;
  views._M_array = (iterator)local_228;
  cmCatViews_abi_cxx11_(&local_410,views);
  bVar1 = cmsys::SystemTools::FileExists(&local_410);
  if (bVar1) {
    local_450._M_string_length = 0;
    local_450.field_2._M_local_buf[0] = '\0';
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::ifstream::ifstream(local_228,local_410._M_dataplus._M_p,_S_in);
    cmsys::SystemTools::GetLineFromStream
              ((istream *)local_228,&local_450,(bool *)0x0,0xffffffffffffffff);
    bVar1 = cmsys::SystemTools::FileExists(&local_450);
    if (bVar1) {
      cmsys::SystemTools::CollapseFullPath((string *)local_3a0,&local_450);
      std::__cxx11::string::operator=((string *)&this->OutputFile,(string *)local_3a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._0_8_ != &local_390) {
        operator_delete((void *)local_3a0._0_8_,local_390._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3a0,"Recorded try_compile output location doesn\'t exist:\n",0x34)
      ;
      local_3f0._M_dataplus._M_p = (char *)0x2;
      local_3f0._M_string_length = 0x6b6c77;
      local_3f0.field_2._M_allocated_capacity = local_450._M_string_length;
      local_3f0.field_2._8_8_ = local_450._M_dataplus._M_p;
      local_3d0 = 1;
      local_3c8 = "\n";
      views_01._M_len = 3;
      views_01._M_array = (iterator)&local_3f0;
      cmCatViews_abi_cxx11_(&local_3c0,views_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3a0,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&this->FindErrorMessage,(string *)&local_3f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
      std::ios_base::~ios_base(local_330);
    }
    std::ifstream::~ifstream(local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,
                      CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                               local_450.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"Unable to find the recorded try_compile output location:\n",
               0x39);
    local_3a0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x2;
    local_3a0._8_8_ = "  ";
    local_390._M_allocated_capacity = local_410._M_string_length;
    local_390._8_8_ = local_410._M_dataplus._M_p;
    local_380 = 1;
    local_378 = "\n";
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_3a0;
    cmCatViews_abi_cxx11_(&local_3f0,views_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,local_3f0._M_dataplus._M_p,local_3f0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->FindErrorMessage,(string *)local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._0_8_ != &local_390) {
      operator_delete((void *)local_3a0._0_8_,local_390._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
    std::ios_base::~ios_base(local_1b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if (local_430[0] != local_420) {
    operator_delete(local_430[0],local_420[0] + 1);
  }
  return;
}

Assistant:

void cmCoreTryCompile::FindOutputFile(const std::string& targetName)
{
  this->FindErrorMessage.clear();
  this->OutputFile.clear();
  std::string tmpOutputFile = "/";
  tmpOutputFile += targetName;

  if (this->Makefile->GetGlobalGenerator()->IsMultiConfig()) {
    tmpOutputFile += "_DEBUG";
  }
  tmpOutputFile += "_loc";

  std::string command = cmStrCat(this->BinaryDirectory, tmpOutputFile);
  if (!cmSystemTools::FileExists(command)) {
    std::ostringstream emsg;
    emsg << "Unable to find the recorded try_compile output location:\n";
    emsg << cmStrCat("  ", command, "\n");
    this->FindErrorMessage = emsg.str();
    return;
  }

  std::string outputFileLocation;
  cmsys::ifstream ifs(command.c_str());
  cmSystemTools::GetLineFromStream(ifs, outputFileLocation);
  if (!cmSystemTools::FileExists(outputFileLocation)) {
    std::ostringstream emsg;
    emsg << "Recorded try_compile output location doesn't exist:\n";
    emsg << cmStrCat("  ", outputFileLocation, "\n");
    this->FindErrorMessage = emsg.str();
    return;
  }

  this->OutputFile = cmSystemTools::CollapseFullPath(outputFileLocation);
}